

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint c;
  
  uVar1 = (doc->pprint).indent[0].spaces;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar2 = (doc->config).value[0x53].v;
  uVar4 = (uint)uVar2;
  uVar3 = uVar5;
  if ((uVar4 != 0 & 0 < (int)uVar1 & indent_char) == 1) {
    uVar3 = 1;
    if (uVar4 <= uVar5) {
      uVar3 = (uint)((ulong)uVar5 / (uVar2 & 0xffffffff));
    }
  }
  for (; uVar3 != 0; uVar3 = uVar3 - 1) {
    c = 0x20;
    if (indent_char != 0) {
      c = 9;
    }
    prvTidyWriteChar(c,doc->docOut);
  }
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  // set number of tabs to output
        if (spaces == 0)    // with a minimum of one
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(indent_char, doc->docOut); /* 20150515 - Issue #108 */

}